

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# verifier.h
# Opt level: O0

void __thiscall
flatbuffers::VerifierTemplate<false>::VerifierTemplate
          (VerifierTemplate<false> *this,uint8_t *buf,size_t buf_len,uoffset_t max_depth,
          uoffset_t max_tables,bool check_alignment)

{
  anon_class_24_3_efc51cbd local_68;
  Options local_50;
  bool local_29;
  uoffset_t local_28;
  uoffset_t uStack_24;
  bool check_alignment_local;
  uoffset_t max_tables_local;
  uoffset_t max_depth_local;
  size_t buf_len_local;
  uint8_t *buf_local;
  VerifierTemplate<false> *this_local;
  
  local_68.max_depth = &stack0xffffffffffffffdc;
  local_68.max_tables = &local_28;
  local_68.check_alignment = &local_29;
  local_29 = check_alignment;
  local_28 = max_tables;
  uStack_24 = max_depth;
  _max_tables_local = buf_len;
  buf_len_local = (size_t)buf;
  buf_local = (uint8_t *)this;
  VerifierTemplate::anon_class_24_3_efc51cbd::operator()(&local_50,&local_68);
  VerifierTemplate(this,buf,buf_len,&local_50);
  return;
}

Assistant:

VerifierTemplate(const uint8_t *const buf, const size_t buf_len,
                   const uoffset_t max_depth = 64,
                   const uoffset_t max_tables = 1000000,
                   const bool check_alignment = true)
      : VerifierTemplate(buf, buf_len, [&] {
          Options opts;
          opts.max_depth = max_depth;
          opts.max_tables = max_tables;
          opts.check_alignment = check_alignment;
          return opts;
        }()) {}